

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

undefined8 bgui::(anonymous_namespace)::createHelpText_abi_cxx11_(void)

{
  undefined8 in_RDI;
  ostringstream out;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::operator<<((ostream *)local_180,"\n");
  std::operator<<((ostream *)local_180,"List:\n");
  std::operator<<((ostream *)local_180,"<cursor left>  Load previous image\n");
  std::operator<<((ostream *)local_180,"<cursor right> Load next image\n");
  std::operator<<((ostream *)local_180,
                  "\'k\'            Switch between keep, keep_all and not keeping the settings when changing between images\n"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return in_RDI;
}

Assistant:

std::string createHelpText()
{
  std::ostringstream out;

  out << "Usage and Keycodes:\n";
  out << "\n";
  out << "left mouse click and moving for panning\n";
  out << "right mouse click (or shift and left mouse click) for pixel information\n";
  out << "mouse wheel for zooming\n";
  out << "\n";
  out << "Information and Exit:\n";
  out << "'h'            Shows this help text.\n";
  out << "'v'            Shows version information.\n";
  out << "'i'            Shows information about the currently viewed image part.\n";
  out << "'q', 'esc'     Exit\n";
  out << "\n";
  out << "Select color channel:\n";
  out << "'C'            Reset color channel selection.\n";
  out << "'R', 'G', 'B'  Shows only the corresponding color channel.\n";
  out << "\n";
  out << "Size and Orientation:\n";
  out << "'0'            (Re)set zoom factor to 1.\n";
  out << "'+', '-'       Zooming in and out.\n";
  out << "'s'            Resize window to size of image at current scaling\n";
  out << "'r', 'l'       Rotate anti-clockwise or clockwise by 90 degrees\n";
  out << "'f'            Flip image horizontally.\n";
  out << "\n";
  out << "Radiometry:\n";
  out << "'t'            Switches smoothing by trilinear filtering on or off.\n";
  out << "'a'            Scale such that currently visible part of the image uses full contrast\n";
  out << "'b', 'w'       Scale such that pixel at current mouse position is black or white\n";
  out << "'m'            Switching between raw, jet and rainbow mapping for greyscale images\n";
  out << "'1', '2', '4'  Setting the corresponding value as gamma factor\n";

  return out.str();
}